

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

int Cnf_DataAddXorClause(void *pSat,int iVarA,int iVarB,int iVarC)

{
  int iVar1;
  lit local_30;
  lit local_2c;
  lit Lits [3];
  int iVarC_local;
  int iVarB_local;
  int iVarA_local;
  void *pSat_local;
  
  Lits[1] = iVarC;
  Lits[2] = iVarB;
  if (((0 < iVarA) && (0 < iVarB)) && (0 < iVarC)) {
    local_30 = toLitCond(iVarA,1);
    local_2c = toLitCond(Lits[2],1);
    Lits[0] = toLitCond(Lits[1],1);
    iVar1 = sat_solver_addclause((sat_solver *)pSat,&local_30,Lits + 1);
    if (iVar1 == 0) {
      pSat_local._4_4_ = 0;
    }
    else {
      local_30 = toLitCond(iVarA,1);
      local_2c = toLitCond(Lits[2],0);
      Lits[0] = toLitCond(Lits[1],0);
      iVar1 = sat_solver_addclause((sat_solver *)pSat,&local_30,Lits + 1);
      if (iVar1 == 0) {
        pSat_local._4_4_ = 0;
      }
      else {
        local_30 = toLitCond(iVarA,0);
        local_2c = toLitCond(Lits[2],1);
        Lits[0] = toLitCond(Lits[1],0);
        iVar1 = sat_solver_addclause((sat_solver *)pSat,&local_30,Lits + 1);
        if (iVar1 == 0) {
          pSat_local._4_4_ = 0;
        }
        else {
          local_30 = toLitCond(iVarA,0);
          local_2c = toLitCond(Lits[2],0);
          Lits[0] = toLitCond(Lits[1],1);
          iVar1 = sat_solver_addclause((sat_solver *)pSat,&local_30,Lits + 1);
          if (iVar1 == 0) {
            pSat_local._4_4_ = 0;
          }
          else {
            pSat_local._4_4_ = 1;
          }
        }
      }
    }
    return pSat_local._4_4_;
  }
  __assert_fail("iVarA > 0 && iVarB > 0 && iVarC > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfMan.c"
                ,0x2b3,"int Cnf_DataAddXorClause(void *, int, int, int)");
}

Assistant:

int Cnf_DataAddXorClause( void * pSat, int iVarA, int iVarB, int iVarC )
{
    lit Lits[3];
    assert( iVarA > 0 && iVarB > 0 && iVarC > 0 );

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 1 );
    if ( !sat_solver_addclause( (sat_solver *)pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 0 );
    if ( !sat_solver_addclause( (sat_solver *)pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 0 );
    if ( !sat_solver_addclause( (sat_solver *)pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 1 );
    if ( !sat_solver_addclause( (sat_solver *)pSat, Lits, Lits + 3 ) )
        return 0;

    return 1;
}